

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O3

MPP_RET mpp_buf_slot_set_flag(MppBufSlots slots,RK_S32 index,SlotUsageType type)

{
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  MPP_RET MVar1;
  undefined4 uVar2;
  
  uVar2 = (undefined4)((ulong)in_RAX >> 0x20);
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_set_flag");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    __mutex = *slots;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if ((index < 0) || (*(int *)((long)slots + 0x60) <= index)) {
      _dump_slots("mpp_buf_slot_set_flag",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_set_flag",
                 CONCAT44(uVar2,0x415));
      abort();
    }
    MVar1 = MPP_OK;
    slot_ops_with_log((MppBufSlotsImpl *)slots,
                      (MppBufSlotEntry *)((ulong)(uint)index * 0x38 + *(long *)((long)slots + 0xe8))
                      ,set_flag_op[type],(void *)0x0);
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buf_slot_set_flag(MppBufSlots slots, RK_S32 index, SlotUsageType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    slot_ops_with_log(impl, &impl->slots[index], set_flag_op[type], NULL);
    return MPP_OK;
}